

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpsctl.c
# Opt level: O3

slReturn nmeaBaudRateSynchronizer(int fdPort,int maxTimeMs,int verbosity)

{
  errInfo error;
  errInfo error_00;
  byte bVar1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  longlong lVar6;
  slReturn pvVar7;
  longlong lVar8;
  void *pvVar9;
  uint uVar10;
  byte unaff_R13B;
  long lVar11;
  bool bVar12;
  byte local_72;
  byte local_71;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  
  lVar6 = currentTimeMs();
  pvVar7 = flushRx(fdPort);
  _Var2 = isErrorReturn(pvVar7);
  if (_Var2) {
    createErrorInfo(&local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                    ,"nmeaBaudRateSynchronizer",0x7b,pvVar7);
    error.fileName = local_50.fileName;
    error.cause = local_50.cause;
    error.functionName = local_50.functionName;
    error.lineNumber = local_50.lineNumber;
    error._28_4_ = local_50._28_4_;
    makeErrorMsgReturn(error,"could not flush receiver prior to synchronization");
  }
  lVar8 = currentTimeMs();
  lVar11 = lVar6 + maxTimeMs;
  if (lVar8 < lVar11) {
    bVar12 = false;
    uVar10 = 0;
    do {
      bVar1 = local_72;
      lVar6 = currentTimeMs();
      pvVar7 = readSerialChar(fdPort,lVar11 - lVar6);
      _Var2 = isErrorReturn(pvVar7);
      if (_Var2) {
        createErrorInfo(&local_70,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                        ,"nmeaBaudRateSynchronizer",0x82,pvVar7);
        error_00.fileName = local_70.fileName;
        error_00.cause = local_70.cause;
        error_00.functionName = local_70.functionName;
        error_00.lineNumber = local_70.lineNumber;
        error_00._28_4_ = local_70._28_4_;
        pvVar7 = makeErrorMsgReturn(error_00,"problem reading a character while synchronizing");
        return pvVar7;
      }
      _Var2 = isWarningReturn(pvVar7);
      if (_Var2) break;
      pvVar9 = getReturnInfo(pvVar7);
      bVar3 = (byte)pvVar9;
      if (bVar12) {
        if ((bVar3 == 0xd) || (((uint)pvVar9 & 0xff) == 10)) {
          if (unaff_R13B == 0x2a) {
            iVar4 = hex2int(local_72);
            unaff_R13B = 0x2a;
            if (((-1 < iVar4) && (uVar5 = hex2int(local_71), -1 < (int)uVar5)) &&
               (uVar10 = uVar10 ^ (int)(char)(local_71 ^ local_72) ^ 0x2a,
               (uVar5 | iVar4 << 4) == uVar10)) {
              pvVar9 = (void *)0x1;
              goto LAB_00105ba2;
            }
          }
          bVar12 = false;
        }
        else {
          uVar10 = uVar10 ^ (int)(char)bVar3;
          bVar12 = true;
          local_72 = local_71;
          local_71 = bVar3;
          unaff_R13B = bVar1;
        }
      }
      else {
        bVar12 = bVar3 == 0x24;
        if (bVar12) {
          uVar10 = 0;
        }
      }
      lVar6 = currentTimeMs();
    } while (lVar6 < lVar11);
  }
  pvVar9 = (void *)0x0;
LAB_00105ba2:
  pvVar7 = makeOkInfoReturn(pvVar9);
  return pvVar7;
}

Assistant:

static slReturn nmeaBaudRateSynchronizer(int fdPort, int maxTimeMs, int verbosity) {

    bool inLine = false;
    char last[3];
    int cksm = 0;
    long long start = currentTimeMs();

    // flush any junk we might have in the receiver buffer...
    slReturn frResp = flushRx(fdPort);
    if (isErrorReturn(frResp))
        makeErrorMsgReturn(ERR_CAUSE(frResp), "could not flush receiver prior to synchronization");

    // read characters until either we appear to be synchronized or we run out of time...
    while (currentTimeMs() < start + maxTimeMs) {

        slReturn rscResp = readSerialChar(fdPort, start + maxTimeMs - currentTimeMs());
        if (isErrorReturn(rscResp))
            return makeErrorMsgReturn(ERR_CAUSE(rscResp), "problem reading a character while synchronizing");
        if (isWarningReturn(rscResp))
            return makeOkInfoReturn(bool2info(false));

        char c = getReturnInfoChar(rscResp);
        if (inLine) {
            if ((c == '\r') || (c == '\n')) {
                if (last[0] == '*') {
                    int un = hex2int(last[1]);
                    if (un >= 0) {
                        int ln = hex2int(last[2]);
                        if (ln >= 0) {
                            int ck = (un << 4) | ln;

                            // correct checksum for the last three characters received...
                            cksm ^= last[0];
                            cksm ^= last[1];
                            cksm ^= last[2];

                            if (ck == cksm) {
                                return makeOkInfoReturn(bool2info(true));
                            }
                        }
                    }
                }
                inLine = false;
            }
            else {
                cksm ^= c;
                last[0] = last[1];
                last[1] = last[2];
                last[2] = c;
            }
        }
        else if (c == '$') {
            inLine = true;
            cksm = 0;
        }
    }
    return makeOkInfoReturn(bool2info(false));
}